

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O0

void __thiscall YsSoundPlayer::APISpecificData::DiscardEnded(APISpecificData *this)

{
  YSBOOL YVar1;
  undefined4 uVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  size_type local_18;
  longlong i;
  APISpecificData *this_local;
  
  local_18 = std::
             vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
             ::size(&this->playing);
  while (local_18 = local_18 - 1, -1 < (long)local_18) {
    pvVar3 = std::
             vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
             ::operator[](&this->playing,local_18);
    if (pvVar3->dat == (SoundData *)0x0) {
      pvVar3 = std::
               vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
               ::back(&this->playing);
      pvVar4 = std::
               vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
               ::operator[](&this->playing,local_18);
      pvVar4->dat = pvVar3->dat;
      YVar1 = pvVar3->loop;
      pvVar4->ptr = pvVar3->ptr;
      pvVar4->loop = YVar1;
      uVar2 = *(undefined4 *)&pvVar3->field_0x14;
      pvVar4->stop = pvVar3->stop;
      *(undefined4 *)&pvVar4->field_0x14 = uVar2;
      sVar5 = std::
              vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
              ::size(&this->playing);
      std::
      vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ::resize(&this->playing,sVar5 - 1);
    }
  }
  sVar5 = std::
          vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
          ::size(&this->playing);
  if (sVar5 == 0) {
    snd_pcm_drop(this->handle);
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::DiscardEnded(void)
{
	for(long long int i=playing.size()-1; 0<=i; --i)
	{
		if(nullptr==playing[i].dat)
		{
			playing[i]=playing.back();
			playing.resize(playing.size()-1);
		}
	}

	if(0==playing.size())
	{
		snd_pcm_drop(handle);
	}
}